

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::BVHNIntersector1<4,_16781328,_false,_embree::avx::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  char cVar13;
  AABBNodeMB4D *node1;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  NodeRef *pNVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined4 uVar25;
  ulong unaff_R15;
  float fVar26;
  float fVar27;
  float fVar32;
  float fVar34;
  vint4 bi;
  undefined1 auVar28 [16];
  float fVar36;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar33;
  float fVar35;
  float fVar37;
  undefined1 auVar31 [16];
  float fVar38;
  float fVar39;
  float fVar47;
  float fVar49;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar51;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar48;
  float fVar50;
  float fVar52;
  undefined1 auVar46 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar74;
  float fVar75;
  vint4 bi_1;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar76;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar77;
  vfloat4 a0;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vint4 ai_3;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  vint4 ai;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  Precalculations pre;
  NodeRef stack [244];
  
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar39 = ray->tfar, 0.0 <= fVar39)) {
    aVar5 = (ray->dir).field_0.field_1;
    auVar53 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
    auVar54 = vrsqrtss_avx(auVar53,auVar53);
    fVar77 = auVar54._0_4_;
    pre.depth_scale = fVar77 * 1.5 - auVar53._0_4_ * 0.5 * fVar77 * fVar77 * fVar77;
    fVar77 = (ray->dir).field_0.m128[0];
    fVar3 = (ray->dir).field_0.m128[1];
    fVar4 = (ray->dir).field_0.m128[2];
    auVar40 = vshufps_avx(ZEXT416((uint)pre.depth_scale),ZEXT416((uint)pre.depth_scale),0);
    auVar78._0_4_ = aVar5.x * auVar40._0_4_;
    auVar78._4_4_ = aVar5.y * auVar40._4_4_;
    auVar78._8_4_ = aVar5.z * auVar40._8_4_;
    auVar78._12_4_ = aVar5.field_3.w * auVar40._12_4_;
    auVar54 = vshufpd_avx(auVar78,auVar78,1);
    auVar53 = vmovshdup_avx(auVar78);
    auVar90._8_4_ = 0x80000000;
    auVar90._0_8_ = 0x8000000080000000;
    auVar90._12_4_ = 0x80000000;
    auVar82._12_4_ = 0;
    auVar82._0_12_ = ZEXT812(0);
    auVar82 = auVar82 << 0x20;
    auVar28 = vunpckhps_avx(auVar78,auVar82);
    auVar66 = vshufps_avx(auVar28,ZEXT416(auVar53._0_4_ ^ 0x80000000),0x41);
    auVar87._0_8_ = auVar54._0_8_ ^ 0x8000000080000000;
    auVar87._8_8_ = auVar54._8_8_ ^ auVar90._8_8_;
    auVar28 = vinsertps_avx(auVar87,auVar78,0x2a);
    auVar53 = vdpps_avx(auVar66,auVar66,0x7f);
    auVar54 = vdpps_avx(auVar28,auVar28,0x7f);
    auVar53 = vcmpps_avx(auVar54,auVar53,1);
    auVar53 = vshufps_avx(auVar53,auVar53,0);
    auVar53 = vblendvps_avx(auVar28,auVar66,auVar53);
    auVar54 = vdpps_avx(auVar53,auVar53,0x7f);
    auVar28 = vrsqrtss_avx(auVar54,auVar54);
    fVar85 = auVar28._0_4_;
    auVar54 = ZEXT416((uint)(fVar85 * 1.5 - auVar54._0_4_ * 0.5 * fVar85 * fVar85 * fVar85));
    auVar54 = vshufps_avx(auVar54,auVar54,0);
    auVar88._0_4_ = auVar53._0_4_ * auVar54._0_4_;
    auVar88._4_4_ = auVar53._4_4_ * auVar54._4_4_;
    auVar88._8_4_ = auVar53._8_4_ * auVar54._8_4_;
    auVar88._12_4_ = auVar53._12_4_ * auVar54._12_4_;
    auVar53 = vshufps_avx(auVar88,auVar88,0xc9);
    auVar54 = vshufps_avx(auVar78,auVar78,0xc9);
    auVar93._0_4_ = auVar54._0_4_ * auVar88._0_4_;
    auVar93._4_4_ = auVar54._4_4_ * auVar88._4_4_;
    auVar93._8_4_ = auVar54._8_4_ * auVar88._8_4_;
    auVar93._12_4_ = auVar54._12_4_ * auVar88._12_4_;
    auVar91._0_4_ = auVar53._0_4_ * auVar78._0_4_;
    auVar91._4_4_ = auVar53._4_4_ * auVar78._4_4_;
    auVar91._8_4_ = auVar53._8_4_ * auVar78._8_4_;
    auVar91._12_4_ = auVar53._12_4_ * auVar78._12_4_;
    auVar53 = vsubps_avx(auVar91,auVar93);
    auVar28 = vshufps_avx(auVar53,auVar53,0xc9);
    auVar53 = vdpps_avx(auVar28,auVar28,0x7f);
    auVar54 = vrsqrtss_avx(auVar53,auVar53);
    fVar85 = auVar54._0_4_;
    auVar53 = ZEXT416((uint)(fVar85 * 1.5 - auVar53._0_4_ * 0.5 * fVar85 * fVar85 * fVar85));
    auVar53 = vshufps_avx(auVar53,auVar53,0);
    auVar54._0_4_ = auVar28._0_4_ * auVar53._0_4_;
    auVar54._4_4_ = auVar28._4_4_ * auVar53._4_4_;
    auVar54._8_4_ = auVar28._8_4_ * auVar53._8_4_;
    auVar54._12_4_ = auVar28._12_4_ * auVar53._12_4_;
    auVar53._0_4_ = auVar40._0_4_ * auVar78._0_4_;
    auVar53._4_4_ = auVar40._4_4_ * auVar78._4_4_;
    auVar53._8_4_ = auVar40._8_4_ * auVar78._8_4_;
    auVar53._12_4_ = auVar40._12_4_ * auVar78._12_4_;
    auVar28 = vunpcklps_avx(auVar88,auVar53);
    auVar53 = vunpckhps_avx(auVar88,auVar53);
    auVar40 = vunpcklps_avx(auVar54,auVar82);
    auVar54 = vunpckhps_avx(auVar54,auVar82);
    pre.ray_space.vz.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar53,auVar54)
    ;
    pre.ray_space.vx.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar28,auVar40)
    ;
    pre.ray_space.vy.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar28,auVar40)
    ;
    pNVar21 = stack + 1;
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    auVar54 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
    auVar28._8_4_ = 0x7fffffff;
    auVar28._0_8_ = 0x7fffffff7fffffff;
    auVar28._12_4_ = 0x7fffffff;
    auVar53 = vandps_avx((undefined1  [16])aVar5,auVar28);
    auVar66._8_4_ = 0x219392ef;
    auVar66._0_8_ = 0x219392ef219392ef;
    auVar66._12_4_ = 0x219392ef;
    auVar53 = vcmpps_avx(auVar53,auVar66,1);
    auVar53 = vblendvps_avx((undefined1  [16])aVar5,auVar66,auVar53);
    auVar28 = vrcpps_avx(auVar53);
    fVar85 = auVar28._0_4_;
    auVar40._0_4_ = auVar53._0_4_ * fVar85;
    fVar6 = auVar28._4_4_;
    auVar40._4_4_ = auVar53._4_4_ * fVar6;
    fVar7 = auVar28._8_4_;
    auVar40._8_4_ = auVar53._8_4_ * fVar7;
    fVar27 = auVar28._12_4_;
    auVar40._12_4_ = auVar53._12_4_ * fVar27;
    auVar67._8_4_ = 0x3f800000;
    auVar67._0_8_ = &DAT_3f8000003f800000;
    auVar67._12_4_ = 0x3f800000;
    auVar53 = vsubps_avx(auVar67,auVar40);
    auVar41._0_4_ = fVar85 + fVar85 * auVar53._0_4_;
    auVar41._4_4_ = fVar6 + fVar6 * auVar53._4_4_;
    auVar41._8_4_ = fVar7 + fVar7 * auVar53._8_4_;
    auVar41._12_4_ = fVar27 + fVar27 * auVar53._12_4_;
    fVar85 = (ray->org).field_0.m128[0];
    auVar89._4_4_ = fVar85;
    auVar89._0_4_ = fVar85;
    auVar89._8_4_ = fVar85;
    auVar89._12_4_ = fVar85;
    fVar6 = (ray->org).field_0.m128[1];
    auVar95._4_4_ = fVar6;
    auVar95._0_4_ = fVar6;
    auVar95._8_4_ = fVar6;
    auVar95._12_4_ = fVar6;
    fVar7 = (ray->org).field_0.m128[2];
    auVar94._4_4_ = fVar7;
    auVar94._0_4_ = fVar7;
    auVar94._8_4_ = fVar7;
    auVar94._12_4_ = fVar7;
    auVar40 = vshufps_avx(auVar41,auVar41,0);
    auVar53 = vmovshdup_avx(auVar41);
    auVar66 = vshufps_avx(auVar41,auVar41,0x55);
    uVar22 = (ulong)(auVar41._0_4_ < 0.0) * 0x10;
    auVar28 = vshufpd_avx(auVar41,auVar41,1);
    auVar82 = vshufps_avx(auVar41,auVar41,0xaa);
    uVar23 = (ulong)(auVar53._0_4_ < 0.0) << 4 | 0x20;
    uVar24 = (ulong)(auVar28._0_4_ < 0.0) << 4 | 0x40;
    auVar53 = vshufps_avx(auVar54,auVar54,0);
    auVar54 = vshufps_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39),0);
    do {
      if (pNVar21 == stack) {
        return;
      }
      uVar16 = pNVar21[-1].ptr;
      pNVar21 = pNVar21 + -1;
      do {
        if ((uVar16 & 8) == 0) {
          fVar39 = (ray->dir).field_0.m128[3];
          uVar17 = (uint)uVar16 & 7;
          uVar14 = uVar16 & 0xfffffffffffffff0;
          if (uVar17 == 3) {
            auVar28 = vshufps_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39),0);
            fVar39 = 1.0 - fVar39;
            auVar41 = vshufps_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39),0);
            fVar38 = auVar28._0_4_;
            fVar47 = auVar28._4_4_;
            fVar49 = auVar28._8_4_;
            fVar51 = auVar28._12_4_;
            auVar28 = vshufps_avx(ZEXT416((uint)(fVar39 * 0.0)),ZEXT416((uint)(fVar39 * 0.0)),0);
            fVar26 = auVar28._0_4_;
            fVar32 = auVar28._4_4_;
            fVar34 = auVar28._8_4_;
            fVar36 = auVar28._12_4_;
            fVar65 = auVar41._0_4_;
            auVar92._0_4_ = fVar65 + fVar38 * *(float *)(uVar14 + 0x110);
            fVar74 = auVar41._4_4_;
            auVar92._4_4_ = fVar74 + fVar47 * *(float *)(uVar14 + 0x114);
            fVar75 = auVar41._8_4_;
            auVar92._8_4_ = fVar75 + fVar49 * *(float *)(uVar14 + 0x118);
            fVar76 = auVar41._12_4_;
            auVar92._12_4_ = fVar76 + fVar51 * *(float *)(uVar14 + 0x11c);
            auVar29._0_4_ =
                 *(float *)(uVar14 + 0x20) * fVar77 +
                 fVar3 * *(float *)(uVar14 + 0x50) + *(float *)(uVar14 + 0x80) * fVar4;
            auVar29._4_4_ =
                 *(float *)(uVar14 + 0x24) * fVar77 +
                 fVar3 * *(float *)(uVar14 + 0x54) + *(float *)(uVar14 + 0x84) * fVar4;
            auVar29._8_4_ =
                 *(float *)(uVar14 + 0x28) * fVar77 +
                 fVar3 * *(float *)(uVar14 + 0x58) + *(float *)(uVar14 + 0x88) * fVar4;
            auVar29._12_4_ =
                 *(float *)(uVar14 + 0x2c) * fVar77 +
                 fVar3 * *(float *)(uVar14 + 0x5c) + *(float *)(uVar14 + 0x8c) * fVar4;
            auVar44._0_4_ =
                 *(float *)(uVar14 + 0x30) * fVar77 +
                 fVar3 * *(float *)(uVar14 + 0x60) + *(float *)(uVar14 + 0x90) * fVar4;
            auVar44._4_4_ =
                 *(float *)(uVar14 + 0x34) * fVar77 +
                 fVar3 * *(float *)(uVar14 + 100) + *(float *)(uVar14 + 0x94) * fVar4;
            auVar44._8_4_ =
                 *(float *)(uVar14 + 0x38) * fVar77 +
                 fVar3 * *(float *)(uVar14 + 0x68) + *(float *)(uVar14 + 0x98) * fVar4;
            auVar44._12_4_ =
                 *(float *)(uVar14 + 0x3c) * fVar77 +
                 fVar3 * *(float *)(uVar14 + 0x6c) + *(float *)(uVar14 + 0x9c) * fVar4;
            auVar70._0_4_ =
                 *(float *)(uVar14 + 0x70) * fVar3 + *(float *)(uVar14 + 0xa0) * fVar4 +
                 *(float *)(uVar14 + 0x40) * fVar77;
            auVar70._4_4_ =
                 *(float *)(uVar14 + 0x74) * fVar3 + *(float *)(uVar14 + 0xa4) * fVar4 +
                 *(float *)(uVar14 + 0x44) * fVar77;
            auVar70._8_4_ =
                 *(float *)(uVar14 + 0x78) * fVar3 + *(float *)(uVar14 + 0xa8) * fVar4 +
                 *(float *)(uVar14 + 0x48) * fVar77;
            auVar70._12_4_ =
                 *(float *)(uVar14 + 0x7c) * fVar3 + *(float *)(uVar14 + 0xac) * fVar4 +
                 *(float *)(uVar14 + 0x4c) * fVar77;
            auVar57._8_4_ = 0x7fffffff;
            auVar57._0_8_ = 0x7fffffff7fffffff;
            auVar57._12_4_ = 0x7fffffff;
            auVar28 = vandps_avx(auVar29,auVar57);
            auVar83._8_4_ = 0x219392ef;
            auVar83._0_8_ = 0x219392ef219392ef;
            auVar83._12_4_ = 0x219392ef;
            auVar28 = vcmpps_avx(auVar28,auVar83,1);
            auVar41 = vblendvps_avx(auVar29,auVar83,auVar28);
            auVar28 = vandps_avx(auVar44,auVar57);
            auVar28 = vcmpps_avx(auVar28,auVar83,1);
            auVar67 = vblendvps_avx(auVar44,auVar83,auVar28);
            auVar28 = vandps_avx(auVar70,auVar57);
            auVar28 = vcmpps_avx(auVar28,auVar83,1);
            auVar28 = vblendvps_avx(auVar70,auVar83,auVar28);
            auVar78 = vrcpps_avx(auVar41);
            fVar96 = auVar78._0_4_;
            auVar30._0_4_ = fVar96 * auVar41._0_4_;
            fVar97 = auVar78._4_4_;
            auVar30._4_4_ = fVar97 * auVar41._4_4_;
            fVar98 = auVar78._8_4_;
            auVar30._8_4_ = fVar98 * auVar41._8_4_;
            fVar99 = auVar78._12_4_;
            auVar30._12_4_ = fVar99 * auVar41._12_4_;
            auVar58._8_4_ = 0x3f800000;
            auVar58._0_8_ = &DAT_3f8000003f800000;
            auVar58._12_4_ = 0x3f800000;
            auVar41 = vsubps_avx(auVar58,auVar30);
            fVar96 = fVar96 + fVar96 * auVar41._0_4_;
            fVar97 = fVar97 + fVar97 * auVar41._4_4_;
            fVar98 = fVar98 + fVar98 * auVar41._8_4_;
            fVar99 = fVar99 + fVar99 * auVar41._12_4_;
            auVar41 = vrcpps_avx(auVar67);
            fVar39 = auVar41._0_4_;
            auVar45._0_4_ = auVar67._0_4_ * fVar39;
            fVar48 = auVar41._4_4_;
            auVar45._4_4_ = auVar67._4_4_ * fVar48;
            fVar50 = auVar41._8_4_;
            auVar45._8_4_ = auVar67._8_4_ * fVar50;
            fVar52 = auVar41._12_4_;
            auVar45._12_4_ = auVar67._12_4_ * fVar52;
            auVar41 = vsubps_avx(auVar58,auVar45);
            fVar39 = fVar39 + fVar39 * auVar41._0_4_;
            fVar48 = fVar48 + fVar48 * auVar41._4_4_;
            fVar50 = fVar50 + fVar50 * auVar41._8_4_;
            fVar52 = fVar52 + fVar52 * auVar41._12_4_;
            auVar41 = vrcpps_avx(auVar28);
            fVar27 = auVar41._0_4_;
            auVar71._0_4_ = auVar28._0_4_ * fVar27;
            fVar33 = auVar41._4_4_;
            auVar71._4_4_ = auVar28._4_4_ * fVar33;
            fVar35 = auVar41._8_4_;
            auVar71._8_4_ = auVar28._8_4_ * fVar35;
            fVar37 = auVar41._12_4_;
            auVar71._12_4_ = auVar28._12_4_ * fVar37;
            auVar28 = vsubps_avx(auVar58,auVar71);
            fVar27 = fVar27 + fVar27 * auVar28._0_4_;
            fVar33 = fVar33 + fVar33 * auVar28._4_4_;
            fVar35 = fVar35 + fVar35 * auVar28._8_4_;
            fVar37 = fVar37 + fVar37 * auVar28._12_4_;
            auVar72._0_4_ =
                 fVar85 * *(float *)(uVar14 + 0x20) +
                 fVar6 * *(float *)(uVar14 + 0x50) +
                 *(float *)(uVar14 + 0x80) * fVar7 + *(float *)(uVar14 + 0xb0);
            auVar72._4_4_ =
                 fVar85 * *(float *)(uVar14 + 0x24) +
                 fVar6 * *(float *)(uVar14 + 0x54) +
                 *(float *)(uVar14 + 0x84) * fVar7 + *(float *)(uVar14 + 0xb4);
            auVar72._8_4_ =
                 fVar85 * *(float *)(uVar14 + 0x28) +
                 fVar6 * *(float *)(uVar14 + 0x58) +
                 *(float *)(uVar14 + 0x88) * fVar7 + *(float *)(uVar14 + 0xb8);
            auVar72._12_4_ =
                 fVar85 * *(float *)(uVar14 + 0x2c) +
                 fVar6 * *(float *)(uVar14 + 0x5c) +
                 *(float *)(uVar14 + 0x8c) * fVar7 + *(float *)(uVar14 + 0xbc);
            auVar64._0_4_ =
                 fVar85 * *(float *)(uVar14 + 0x30) +
                 *(float *)(uVar14 + 0x90) * fVar7 + *(float *)(uVar14 + 0xc0) +
                 fVar6 * *(float *)(uVar14 + 0x60);
            auVar64._4_4_ =
                 fVar85 * *(float *)(uVar14 + 0x34) +
                 *(float *)(uVar14 + 0x94) * fVar7 + *(float *)(uVar14 + 0xc4) +
                 fVar6 * *(float *)(uVar14 + 100);
            auVar64._8_4_ =
                 fVar85 * *(float *)(uVar14 + 0x38) +
                 *(float *)(uVar14 + 0x98) * fVar7 + *(float *)(uVar14 + 200) +
                 fVar6 * *(float *)(uVar14 + 0x68);
            auVar64._12_4_ =
                 fVar85 * *(float *)(uVar14 + 0x3c) +
                 *(float *)(uVar14 + 0x9c) * fVar7 + *(float *)(uVar14 + 0xcc) +
                 fVar6 * *(float *)(uVar14 + 0x6c);
            auVar59._0_4_ =
                 fVar85 * *(float *)(uVar14 + 0x40) +
                 fVar6 * *(float *)(uVar14 + 0x70) +
                 fVar7 * *(float *)(uVar14 + 0xa0) + *(float *)(uVar14 + 0xd0);
            auVar59._4_4_ =
                 fVar85 * *(float *)(uVar14 + 0x44) +
                 fVar6 * *(float *)(uVar14 + 0x74) +
                 fVar7 * *(float *)(uVar14 + 0xa4) + *(float *)(uVar14 + 0xd4);
            auVar59._8_4_ =
                 fVar85 * *(float *)(uVar14 + 0x48) +
                 fVar6 * *(float *)(uVar14 + 0x78) +
                 fVar7 * *(float *)(uVar14 + 0xa8) + *(float *)(uVar14 + 0xd8);
            auVar59._12_4_ =
                 fVar85 * *(float *)(uVar14 + 0x4c) +
                 fVar6 * *(float *)(uVar14 + 0x7c) +
                 fVar7 * *(float *)(uVar14 + 0xac) + *(float *)(uVar14 + 0xdc);
            auVar10._4_4_ = fVar32 + fVar47 * *(float *)(uVar14 + 0xe4);
            auVar10._0_4_ = fVar26 + fVar38 * *(float *)(uVar14 + 0xe0);
            auVar10._8_4_ = fVar34 + fVar49 * *(float *)(uVar14 + 0xe8);
            auVar10._12_4_ = fVar36 + fVar51 * *(float *)(uVar14 + 0xec);
            auVar28 = vsubps_avx(auVar10,auVar72);
            auVar41 = vsubps_avx(auVar92,auVar72);
            auVar8._4_4_ = fVar32 + fVar47 * *(float *)(uVar14 + 0xf4);
            auVar8._0_4_ = fVar26 + fVar38 * *(float *)(uVar14 + 0xf0);
            auVar8._8_4_ = fVar34 + fVar49 * *(float *)(uVar14 + 0xf8);
            auVar8._12_4_ = fVar36 + fVar51 * *(float *)(uVar14 + 0xfc);
            auVar67 = vsubps_avx(auVar8,auVar64);
            auVar9._4_4_ = fVar47 * *(float *)(uVar14 + 0x124) + fVar74;
            auVar9._0_4_ = fVar38 * *(float *)(uVar14 + 0x120) + fVar65;
            auVar9._8_4_ = fVar49 * *(float *)(uVar14 + 0x128) + fVar75;
            auVar9._12_4_ = fVar51 * *(float *)(uVar14 + 300) + fVar76;
            auVar78 = vsubps_avx(auVar9,auVar64);
            auVar12._4_4_ = fVar47 * *(float *)(uVar14 + 0x104) + fVar32;
            auVar12._0_4_ = fVar38 * *(float *)(uVar14 + 0x100) + fVar26;
            auVar12._8_4_ = fVar49 * *(float *)(uVar14 + 0x108) + fVar34;
            auVar12._12_4_ = fVar51 * *(float *)(uVar14 + 0x10c) + fVar36;
            auVar87 = vsubps_avx(auVar12,auVar59);
            auVar11._4_4_ = fVar74 + fVar47 * *(float *)(uVar14 + 0x134);
            auVar11._0_4_ = fVar65 + fVar38 * *(float *)(uVar14 + 0x130);
            auVar11._8_4_ = fVar75 + fVar49 * *(float *)(uVar14 + 0x138);
            auVar11._12_4_ = fVar76 + fVar51 * *(float *)(uVar14 + 0x13c);
            auVar88 = vsubps_avx(auVar11,auVar59);
            auVar81._0_4_ = fVar96 * auVar28._0_4_;
            auVar81._4_4_ = fVar97 * auVar28._4_4_;
            auVar81._8_4_ = fVar98 * auVar28._8_4_;
            auVar81._12_4_ = fVar99 * auVar28._12_4_;
            auVar73._0_4_ = fVar96 * auVar41._0_4_;
            auVar73._4_4_ = fVar97 * auVar41._4_4_;
            auVar73._8_4_ = fVar98 * auVar41._8_4_;
            auVar73._12_4_ = fVar99 * auVar41._12_4_;
            auVar84._0_4_ = auVar67._0_4_ * fVar39;
            auVar84._4_4_ = auVar67._4_4_ * fVar48;
            auVar84._8_4_ = auVar67._8_4_ * fVar50;
            auVar84._12_4_ = auVar67._12_4_ * fVar52;
            auVar86._0_4_ = auVar87._0_4_ * fVar27;
            auVar86._4_4_ = auVar87._4_4_ * fVar33;
            auVar86._8_4_ = auVar87._8_4_ * fVar35;
            auVar86._12_4_ = auVar87._12_4_ * fVar37;
            auVar46._0_4_ = auVar78._0_4_ * fVar39;
            auVar46._4_4_ = auVar78._4_4_ * fVar48;
            auVar46._8_4_ = auVar78._8_4_ * fVar50;
            auVar46._12_4_ = auVar78._12_4_ * fVar52;
            auVar31._0_4_ = auVar88._0_4_ * fVar27;
            auVar31._4_4_ = auVar88._4_4_ * fVar33;
            auVar31._8_4_ = auVar88._8_4_ * fVar35;
            auVar31._12_4_ = auVar88._12_4_ * fVar37;
            auVar28 = vpminsd_avx(auVar84,auVar46);
            auVar41 = vpminsd_avx(auVar86,auVar31);
            auVar28 = vmaxps_avx(auVar28,auVar41);
            auVar87 = vpminsd_avx(auVar81,auVar73);
            auVar78 = vpmaxsd_avx(auVar81,auVar73);
            auVar41 = vpmaxsd_avx(auVar84,auVar46);
            auVar67 = vpmaxsd_avx(auVar86,auVar31);
            auVar67 = vminps_avx(auVar41,auVar67);
            auVar41 = vmaxps_avx(auVar53,auVar87);
            auVar28 = vmaxps_avx(auVar41,auVar28);
            auVar41 = vminps_avx(auVar54,auVar78);
            auVar41 = vminps_avx(auVar41,auVar67);
            auVar28 = vcmpps_avx(auVar28,auVar41,2);
          }
          else {
            auVar78 = vshufps_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39),0);
            pfVar2 = (float *)(uVar14 + 0x80 + uVar22);
            fVar39 = auVar78._0_4_;
            fVar27 = auVar78._4_4_;
            fVar48 = auVar78._8_4_;
            fVar33 = auVar78._12_4_;
            pfVar1 = (float *)(uVar14 + 0x20 + uVar22);
            auVar42._0_4_ = fVar39 * *pfVar2 + *pfVar1;
            auVar42._4_4_ = fVar27 * pfVar2[1] + pfVar1[1];
            auVar42._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar42._12_4_ = fVar33 * pfVar2[3] + pfVar1[3];
            auVar28 = vsubps_avx(auVar42,auVar89);
            pfVar2 = (float *)(uVar14 + 0x80 + uVar23);
            auVar43._0_4_ = auVar40._0_4_ * auVar28._0_4_;
            auVar43._4_4_ = auVar40._4_4_ * auVar28._4_4_;
            auVar43._8_4_ = auVar40._8_4_ * auVar28._8_4_;
            auVar43._12_4_ = auVar40._12_4_ * auVar28._12_4_;
            pfVar1 = (float *)(uVar14 + 0x20 + uVar23);
            auVar55._0_4_ = fVar39 * *pfVar2 + *pfVar1;
            auVar55._4_4_ = fVar27 * pfVar2[1] + pfVar1[1];
            auVar55._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar55._12_4_ = fVar33 * pfVar2[3] + pfVar1[3];
            auVar28 = vsubps_avx(auVar55,auVar95);
            pfVar2 = (float *)(uVar14 + 0x80 + uVar24);
            pfVar1 = (float *)(uVar14 + 0x20 + uVar24);
            auVar60._0_4_ = fVar39 * *pfVar2 + *pfVar1;
            auVar60._4_4_ = fVar27 * pfVar2[1] + pfVar1[1];
            auVar60._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar60._12_4_ = fVar33 * pfVar2[3] + pfVar1[3];
            auVar56._0_4_ = auVar66._0_4_ * auVar28._0_4_;
            auVar56._4_4_ = auVar66._4_4_ * auVar28._4_4_;
            auVar56._8_4_ = auVar66._8_4_ * auVar28._8_4_;
            auVar56._12_4_ = auVar66._12_4_ * auVar28._12_4_;
            auVar28 = vsubps_avx(auVar60,auVar94);
            auVar61._0_4_ = auVar82._0_4_ * auVar28._0_4_;
            auVar61._4_4_ = auVar82._4_4_ * auVar28._4_4_;
            auVar61._8_4_ = auVar82._8_4_ * auVar28._8_4_;
            auVar61._12_4_ = auVar82._12_4_ * auVar28._12_4_;
            auVar28 = vmaxps_avx(auVar56,auVar61);
            pfVar2 = (float *)(uVar14 + 0x80 + (uVar22 ^ 0x10));
            pfVar1 = (float *)(uVar14 + 0x20 + (uVar22 ^ 0x10));
            auVar62._0_4_ = fVar39 * *pfVar2 + *pfVar1;
            auVar62._4_4_ = fVar27 * pfVar2[1] + pfVar1[1];
            auVar62._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar62._12_4_ = fVar33 * pfVar2[3] + pfVar1[3];
            auVar41 = vsubps_avx(auVar62,auVar89);
            auVar63._0_4_ = auVar40._0_4_ * auVar41._0_4_;
            auVar63._4_4_ = auVar40._4_4_ * auVar41._4_4_;
            auVar63._8_4_ = auVar40._8_4_ * auVar41._8_4_;
            auVar63._12_4_ = auVar40._12_4_ * auVar41._12_4_;
            pfVar2 = (float *)(uVar14 + 0x80 + (uVar23 ^ 0x10));
            pfVar1 = (float *)(uVar14 + 0x20 + (uVar23 ^ 0x10));
            auVar68._0_4_ = fVar39 * *pfVar2 + *pfVar1;
            auVar68._4_4_ = fVar27 * pfVar2[1] + pfVar1[1];
            auVar68._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar68._12_4_ = fVar33 * pfVar2[3] + pfVar1[3];
            auVar41 = vsubps_avx(auVar68,auVar95);
            auVar69._0_4_ = auVar66._0_4_ * auVar41._0_4_;
            auVar69._4_4_ = auVar66._4_4_ * auVar41._4_4_;
            auVar69._8_4_ = auVar66._8_4_ * auVar41._8_4_;
            auVar69._12_4_ = auVar66._12_4_ * auVar41._12_4_;
            pfVar2 = (float *)(uVar14 + 0x80 + (uVar24 ^ 0x10));
            pfVar1 = (float *)(uVar14 + 0x20 + (uVar24 ^ 0x10));
            auVar79._0_4_ = fVar39 * *pfVar2 + *pfVar1;
            auVar79._4_4_ = fVar27 * pfVar2[1] + pfVar1[1];
            auVar79._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar79._12_4_ = fVar33 * pfVar2[3] + pfVar1[3];
            auVar41 = vsubps_avx(auVar79,auVar94);
            auVar80._0_4_ = auVar82._0_4_ * auVar41._0_4_;
            auVar80._4_4_ = auVar82._4_4_ * auVar41._4_4_;
            auVar80._8_4_ = auVar82._8_4_ * auVar41._8_4_;
            auVar80._12_4_ = auVar82._12_4_ * auVar41._12_4_;
            auVar67 = vminps_avx(auVar69,auVar80);
            auVar41 = vmaxps_avx(auVar53,auVar43);
            auVar28 = vmaxps_avx(auVar41,auVar28);
            auVar41 = vminps_avx(auVar54,auVar63);
            auVar41 = vminps_avx(auVar41,auVar67);
            if (uVar17 == 6) {
              auVar41 = vcmpps_avx(auVar28,auVar41,2);
              auVar28 = vcmpps_avx(*(undefined1 (*) [16])(uVar14 + 0xe0),auVar78,2);
              auVar67 = vcmpps_avx(auVar78,*(undefined1 (*) [16])(uVar14 + 0xf0),1);
              auVar28 = vandps_avx(auVar28,auVar67);
              auVar28 = vandps_avx(auVar28,auVar41);
            }
            else {
              auVar28 = vcmpps_avx(auVar28,auVar41,2);
            }
            auVar28 = vpslld_avx(auVar28,0x1f);
          }
          uVar25 = vmovmskps_avx(auVar28);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar25);
        }
        if ((uVar16 & 8) == 0) {
          if (unaff_R15 == 0) {
            iVar18 = 4;
          }
          else {
            uVar14 = uVar16 & 0xfffffffffffffff0;
            lVar20 = 0;
            if (unaff_R15 != 0) {
              for (; (unaff_R15 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
            iVar18 = 0;
            uVar16 = *(ulong *)(uVar14 + lVar20 * 8);
            uVar19 = unaff_R15 - 1 & unaff_R15;
            if (uVar19 != 0) {
              pNVar21->ptr = uVar16;
              lVar20 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                }
              }
              uVar15 = uVar19 - 1;
              while( true ) {
                pNVar21 = pNVar21 + 1;
                uVar16 = *(ulong *)(uVar14 + lVar20 * 8);
                uVar15 = uVar15 & uVar19;
                if (uVar15 == 0) break;
                pNVar21->ptr = uVar16;
                lVar20 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                  }
                }
                uVar19 = uVar15 - 1;
              }
            }
          }
        }
        else {
          iVar18 = 6;
        }
      } while (iVar18 == 0);
      if (iVar18 == 6) {
        cVar13 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar16 & 0xfffffffffffffff0) * 0x40 + 8))
                           (&pre,ray,context);
        iVar18 = 0;
        if (cVar13 != '\0') {
          ray->tfar = -INFINITY;
          iVar18 = 3;
        }
      }
    } while (iVar18 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }